

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

int parse_jobs(pmtr_t *cfg,UT_string *em)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  void *yyp;
  UT_array *pUVar4;
  uint *local_2b8;
  uint *local_2a8;
  int local_29c;
  ulong local_298;
  size_t _ut_i;
  job_t job;
  int id;
  void *p;
  parse_t ps;
  UT_array *toks;
  size_t toklen;
  size_t len;
  char *tok;
  char *c;
  char *buf;
  UT_string *em_local;
  pmtr_t *cfg_local;
  
  buf = (char *)em;
  em_local = (UT_string *)cfg;
  ps.cfg = (pmtr_t *)malloc(0x30);
  memset(ps.cfg,0,0x30);
  (ps.cfg)->pidfile = (char *)8;
  *(undefined1 **)&(ps.cfg)->verbose = (undefined1 *)0x0;
  *(code **)&(ps.cfg)->test_only = utarray_str_cpy;
  *(code **)&(ps.cfg)->dm_pid = utarray_str_dtor;
  job_ini((job_t *)&_ut_i);
  ps.em = (UT_string *)&_ut_i;
  ps.job = (job_t *)em_local;
  p._0_4_ = 1;
  ps._0_8_ = buf;
  p._4_4_ = 0;
  yyp = ParseAlloc(malloc);
  iVar3 = slurp((ps.job)->name,&c,&toklen);
  if (iVar3 < 0) {
    p._4_4_ = -1;
  }
  else {
    tok = c;
    while (job.cpuset.__bits[0xf]._4_4_ = get_tok(c,&tok,&toklen,(size_t *)&toks,(int *)&p),
          0 < (int)job.cpuset.__bits[0xf]._4_4_) {
      len = (size_t)strndup(tok,(size_t)toks);
      if (*(uint *)((long)&(ps.cfg)->file + 4) < *(int *)&(ps.cfg)->file + 1U) {
        while (*(uint *)((long)&(ps.cfg)->file + 4) < *(int *)&(ps.cfg)->file + 1U) {
          if (*(int *)((long)&(ps.cfg)->file + 4) == 0) {
            local_29c = 8;
          }
          else {
            local_29c = *(int *)((long)&(ps.cfg)->file + 4) << 1;
          }
          *(int *)((long)&(ps.cfg)->file + 4) = local_29c;
        }
        pUVar4 = (UT_array *)
                 realloc((ps.cfg)->jobs,
                         (ulong)*(uint *)((long)&(ps.cfg)->file + 4) * (long)(ps.cfg)->pidfile);
        (ps.cfg)->jobs = pUVar4;
        if (pUVar4 == (UT_array *)0x0) {
          exit(-1);
        }
      }
      lVar2._0_4_ = (ps.cfg)->test_only;
      lVar2._4_4_ = (ps.cfg)->echo_syslog_to_stderr;
      if (lVar2 == 0) {
        uVar1 = *(uint *)&(ps.cfg)->file;
        *(uint *)&(ps.cfg)->file = uVar1 + 1;
        memcpy((uint *)((long)&(ps.cfg)->jobs->i + (long)(ps.cfg)->pidfile * (ulong)uVar1),&len,
               (size_t)(ps.cfg)->pidfile);
      }
      else {
        uVar1 = *(uint *)&(ps.cfg)->file;
        *(uint *)&(ps.cfg)->file = uVar1 + 1;
        (**(code **)&(ps.cfg)->test_only)
                  ((uint *)((long)&(ps.cfg)->jobs->i + (long)(ps.cfg)->pidfile * (ulong)uVar1),&len)
        ;
      }
      free((void *)len);
      if (*(int *)&(ps.cfg)->file == 0) {
        local_2a8 = (uint *)0x0;
      }
      else {
        local_2a8 = (uint *)((long)&(ps.cfg)->jobs->i +
                            (long)(ps.cfg)->pidfile * (ulong)(*(int *)&(ps.cfg)->file - 1));
      }
      len = *(size_t *)local_2a8;
      if (1 < (int)em_local->i) {
        printf("token [%s] id=%d line=%d\n",len,(ulong)job.cpuset.__bits[0xf]._4_4_,(ulong)(uint)p);
      }
      Parse(yyp,job.cpuset.__bits[0xf]._4_4_,(char *)len,(parse_t *)&p);
      if (p._4_4_ == -1) goto LAB_001068e8;
      toklen = toklen - (long)toks;
      tok = tok + (long)&toks->i;
    }
    if (job.cpuset.__bits[0xf]._4_4_ == 0xffffffff) {
      utstring_printf((UT_string *)buf,"syntax error in %s line %d",(ps.job)->name,(ulong)(uint)p);
      p._4_4_ = -1;
    }
    else {
      Parse(yyp,0,(char *)0x0,(parse_t *)&p);
      if (p._4_4_ != -1) {
        qsort(*(void **)(em_local[1].i + 0x28),(ulong)*(uint *)em_local[1].i,
              *(size_t *)(em_local[1].i + 8),order_sort);
        hash_deps((UT_array *)em_local[1].i);
      }
    }
  }
LAB_001068e8:
  if (*(int *)((long)&(ps.cfg)->file + 4) != 0) {
    if (*(long *)&(ps.cfg)->dm_pid != 0) {
      for (local_298 = 0; local_298 < *(uint *)&(ps.cfg)->file; local_298 = local_298 + 1) {
        if (local_298 < *(uint *)&(ps.cfg)->file) {
          local_2b8 = (uint *)((long)&(ps.cfg)->jobs->i + (long)(ps.cfg)->pidfile * local_298);
        }
        else {
          local_2b8 = (uint *)0x0;
        }
        (**(code **)&(ps.cfg)->dm_pid)(local_2b8);
      }
    }
    free((ps.cfg)->jobs);
  }
  *(undefined4 *)((long)&(ps.cfg)->file + 4) = 0;
  free(ps.cfg);
  ParseFree(yyp,free);
  if (c != (char *)0x0) {
    free(c);
  }
  job_fin((job_t *)&_ut_i);
  return p._4_4_;
}

Assistant:

int parse_jobs(pmtr_t *cfg, UT_string *em) {
  char *buf, *c, *tok;
  size_t len,toklen;
  UT_array *toks;
  parse_t ps; /* our own parser state */ 
  void *p;    /* lemon parser */
  int id;

  utarray_new(toks,&ut_str_icd);
  job_t job;  /* "scratch" space used when parsing a job */
  job_ini(&job);
  ps.job=&job; 

  ps.cfg=cfg;
  ps.line=1; 
  ps.em=em;
  ps.rc=0;

  p = ParseAlloc(malloc);

  if (slurp(ps.cfg->file, &buf, &len) < 0) {ps.rc=-1; goto done;}
  c = buf;
  while ( (id=get_tok(buf,&c,&len,&toklen,&ps.line)) > 0) {
    tok = strndup(c,toklen); utarray_push_back(toks,&tok); free(tok); 
    tok = *(char**)utarray_back(toks);
    if (cfg->verbose >=2) printf("token [%s] id=%d line=%d\n",tok, id, ps.line);
    Parse(p, id, tok, &ps);
    if (ps.rc == -1) goto done;
    len -= toklen;
    c += toklen;
  }
  if (id == -1) {
    utstring_printf(em,"syntax error in %s line %d", ps.cfg->file, ps.line);
    ps.rc = -1;
    goto done;
  }
  Parse(p, 0, NULL, &ps);
  if (ps.rc == -1) goto done;

  /* parsing succeeded */
  utarray_sort(cfg->jobs, order_sort);
  hash_deps(cfg->jobs);

 done:
  utarray_free(toks);
  ParseFree(p, free);
  if (buf) free(buf);
  job_fin(&job);
  return ps.rc;
}